

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

float __thiscall MetaCommand::GetValueAsFloat(MetaCommand *this,Option *option,string *fieldName)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  iterator __lhs;
  iterator __rhs;
  char *__nptr;
  string *in_RDX;
  string *in_RSI;
  double dVar4;
  const_iterator itField;
  string fieldname;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_58 [3];
  string local_40 [60];
  float local_4;
  
  std::__cxx11::string::string(local_40,in_RDX);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=(local_40,in_RSI);
  }
  __lhs = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                    ((vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *)in_RDX);
  __gnu_cxx::
  __normal_iterator<MetaCommand::Field_const*,std::vector<MetaCommand::Field,std::allocator<MetaCommand::Field>>>
  ::__normal_iterator<MetaCommand::Field*>
            ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
              *)in_RSI,
             (__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
              *)in_RDX);
  do {
    __rhs = std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::end
                      ((vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *)in_RDX);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                        *)in_RSI,
                       (__normal_iterator<MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                        *)in_RDX);
    if (!bVar1) {
      local_4 = 0.0;
LAB_00126b84:
      std::__cxx11::string::~string(local_40);
      return local_4;
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
    ::operator*(local_58);
    _Var2 = std::operator==(&(__lhs._M_current)->name,&(__rhs._M_current)->name);
    if (_Var2) {
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator*(local_58);
      __nptr = (char *)std::__cxx11::string::c_str();
      dVar4 = atof(__nptr);
      local_4 = (float)dVar4;
      goto LAB_00126b84;
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
    ::operator++(local_58);
  } while( true );
}

Assistant:

float MetaCommand::GetValueAsFloat(Option option,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = option.name;
  }

  METAIO_STL::vector<Field>::const_iterator itField = option.fields.begin();
  while(itField != option.fields.end())
    {
    if((*itField).name == fieldname)
      {
      return (float)atof((*itField).value.c_str());
      }
    ++itField;
    }
  return 0;
}